

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void EOPLL_SetChipMode(EOPLL *opll,UINT8 Mode)

{
  UINT8 Mode_local;
  EOPLL *opll_local;
  
  opll->vrc7_mode = Mode;
  if (opll->vrc7_mode == '\0') {
    EOPLL_setPatch(opll,default_inst[0]);
  }
  else {
    EOPLL_setPatch(opll,default_inst[1]);
  }
  return;
}

Assistant:

void EOPLL_SetChipMode(EOPLL* opll, UINT8 Mode)
{
  // Enable/Disable VRC7 Mode (with only 6 instead of 9 channels and no rhythm part)
  opll->vrc7_mode = Mode;
  if (opll->vrc7_mode)
    EOPLL_setPatch(opll, default_inst[EOPLL_VRC7_TONE]);
  else
    EOPLL_setPatch(opll, default_inst[EOPLL_2413_TONE]);
  
  return;
}